

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O3

Reals __thiscall Omega_h::get_nelems_per_elem(Omega_h *this,Mesh *mesh,Reals *v2m)

{
  int *piVar1;
  uint uVar2;
  Alloc *pAVar3;
  void *pvVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  double b;
  Read<double> RVar5;
  Reals RVar6;
  Reals complexity;
  Read<double> local_58;
  Alloc *local_48;
  void *local_40;
  Reals local_38;
  
  local_38.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38.write_.shared_alloc_.alloc =
           (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_38.write_.shared_alloc_.alloc)->use_count =
           (local_38.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar3 = local_38.write_.shared_alloc_.alloc;
  local_38.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
  get_complexity_per_elem((Omega_h *)&local_48,mesh,&local_38);
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    piVar1 = &pAVar3->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  local_58.write_.shared_alloc_.alloc = local_48;
  if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc = (Alloc *)(local_48->size * 8 + 1);
    }
    else {
      local_48->use_count = local_48->use_count + 1;
    }
  }
  local_58.write_.shared_alloc_.direct_ptr = local_40;
  uVar2 = mesh->dim_;
  if (uVar2 < 4) {
    if (uVar2 == 3) {
      b = 11.919887387328211;
    }
    else {
      b = *(double *)(&DAT_0044bb10 + (ulong)(uVar2 == 2) * 8);
    }
    RVar5 = multiply_each_by<double>(this,&local_58,b);
    pAVar3 = local_58.write_.shared_alloc_.alloc;
    pvVar4 = RVar5.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_58.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_58.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar4 = extraout_RDX;
      }
    }
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      piVar1 = &local_48->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_48);
        operator_delete(local_48,0x48);
        pvVar4 = extraout_RDX_00;
      }
    }
    RVar6.write_.shared_alloc_.direct_ptr = pvVar4;
    RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

Reals get_nelems_per_elem(Mesh* mesh, Reals v2m) {
  auto complexity = get_complexity_per_elem(mesh, v2m);
  return multiply_each_by(
      complexity, 1.0 / typical_unit_simplex_size(mesh->dim()));
}